

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Time.cpp
# Opt level: O1

int64 __thiscall Time::toTimestamp(Time *this)

{
  long lVar1;
  tm tm;
  tm local_38;
  
  local_38.tm_sec = this->sec;
  local_38.tm_min = this->min;
  local_38.tm_hour = this->hour;
  local_38.tm_mday = this->day;
  local_38.tm_mon = this->month + -1;
  local_38.tm_year = this->year + -0x76c;
  local_38.tm_wday = this->wday;
  local_38.tm_yday = this->yday;
  local_38.tm_isdst = (int)this->dst;
  if (this->utc == true) {
    lVar1 = timegm(&local_38);
  }
  else {
    lVar1 = mktime(&local_38);
  }
  return lVar1 * 1000;
}

Assistant:

int64 Time::toTimestamp()
{
  tm tm;
  tm.tm_sec = sec;
  tm.tm_min = min;
  tm.tm_hour = hour;
  tm.tm_mday = day;
  tm.tm_mon = month - 1;
  tm.tm_year = year - 1900;
  tm.tm_wday = wday;
  tm.tm_yday = yday;
  tm.tm_isdst = dst;
  if(utc)
#ifdef _MSC_VER
    return _mkgmtime(&tm) * 1000LL;
#else
    return timegm(&tm) * 1000LL;
#endif
  else
    return mktime(&tm) * 1000LL;
}